

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pagerOpenSavepoint(Pager *pPager,int nSavepoint)

{
  Pgno PVar1;
  Wal *pWVar2;
  PagerSavepoint *pPVar3;
  ulong uVar4;
  Bitvec *__s;
  int iVar5;
  int iVar6;
  u32 *puVar7;
  
  iVar6 = pPager->nSavepoint;
  pPVar3 = (PagerSavepoint *)sqlite3Realloc(pPager->aSavepoint,(long)nSavepoint * 0x38);
  iVar5 = 7;
  if (pPVar3 != (PagerSavepoint *)0x0) {
    iVar5 = 0;
    memset(pPVar3 + iVar6,0,(long)(nSavepoint - iVar6) * 0x38);
    pPager->aSavepoint = pPVar3;
    if (iVar6 < nSavepoint) {
      puVar7 = pPVar3[iVar6].aWalData + 3;
      do {
        iVar6 = iVar6 + 1;
        PVar1 = pPager->dbSize;
        puVar7[-6] = PVar1;
        if ((pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) ||
           (uVar4 = pPager->journalOff, (long)uVar4 < 1)) {
          uVar4 = (ulong)pPager->sectorSize;
        }
        ((PagerSavepoint *)(puVar7 + -0xc))->iOffset = uVar4;
        puVar7[-5] = pPager->nSubRec;
        __s = (Bitvec *)sqlite3Malloc(0x200);
        if (__s == (Bitvec *)0x0) {
          *(Bitvec **)(puVar7 + -8) = (Bitvec *)0x0;
          puVar7[-4] = 1;
          return 7;
        }
        memset(__s,0,0x200);
        __s->iSize = PVar1;
        *(Bitvec **)(puVar7 + -8) = __s;
        puVar7[-4] = 1;
        pWVar2 = pPager->pWal;
        if (pWVar2 != (Wal *)0x0) {
          puVar7[-3] = (pWVar2->hdr).mxFrame;
          puVar7[-2] = (pWVar2->hdr).aFrameCksum[0];
          puVar7[-1] = (pWVar2->hdr).aFrameCksum[1];
          *puVar7 = pWVar2->nCkpt;
        }
        pPager->nSavepoint = iVar6;
        puVar7 = puVar7 + 0xe;
      } while (iVar6 != nSavepoint);
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static SQLITE_NOINLINE int pagerOpenSavepoint(Pager *pPager, int nSavepoint){
  int rc = SQLITE_OK;                       /* Return code */
  int nCurrent = pPager->nSavepoint;        /* Current number of savepoints */
  int ii;                                   /* Iterator variable */
  PagerSavepoint *aNew;                     /* New Pager.aSavepoint array */

  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );
  assert( nSavepoint>nCurrent && pPager->useJournal );

  /* Grow the Pager.aSavepoint array using realloc(). Return SQLITE_NOMEM
  ** if the allocation fails. Otherwise, zero the new portion in case a
  ** malloc failure occurs while populating it in the for(...) loop below.
  */
  aNew = (PagerSavepoint *)sqlite3Realloc(
      pPager->aSavepoint, sizeof(PagerSavepoint)*nSavepoint
  );
  if( !aNew ){
    return SQLITE_NOMEM_BKPT;
  }
  memset(&aNew[nCurrent], 0, (nSavepoint-nCurrent) * sizeof(PagerSavepoint));
  pPager->aSavepoint = aNew;

  /* Populate the PagerSavepoint structures just allocated. */
  for(ii=nCurrent; ii<nSavepoint; ii++){
    aNew[ii].nOrig = pPager->dbSize;
    if( isOpen(pPager->jfd) && pPager->journalOff>0 ){
      aNew[ii].iOffset = pPager->journalOff;
    }else{
      aNew[ii].iOffset = JOURNAL_HDR_SZ(pPager);
    }
    aNew[ii].iSubRec = pPager->nSubRec;
    aNew[ii].pInSavepoint = sqlite3BitvecCreate(pPager->dbSize);
    aNew[ii].bTruncateOnRelease = 1;
    if( !aNew[ii].pInSavepoint ){
      return SQLITE_NOMEM_BKPT;
    }
    if( pagerUseWal(pPager) ){
      sqlite3WalSavepoint(pPager->pWal, aNew[ii].aWalData);
    }
    pPager->nSavepoint = ii+1;
  }
  assert( pPager->nSavepoint==nSavepoint );
  assertTruncateConstraint(pPager);
  return rc;
}